

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::SystemIdentifier::Encode(SystemIdentifier *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>(stream,this->m_ui16SystemType);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16SystemName);
  KDataStream::Write(stream,this->m_ui8SystemMode);
  KDataStream::Write(stream,(this->field_3).m_ui8ChangeOptions);
  return;
}

Assistant:

void SystemIdentifier::Encode( KDataStream & stream ) const
{
    stream << m_ui16SystemType
           << m_ui16SystemName
           << m_ui8SystemMode
           << m_ui8ChangeOptions;
}